

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void accumulate_next_frame_stats
               (FIRSTPASS_STATS *stats,int flash_detected,int frames_since_key,int cur_idx,
               GF_GROUP_STATS *gf_stats,int f_w,int f_h)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  accumulate_frame_motion_stats(stats,gf_stats,(double)f_w,(double)f_h);
  dVar1 = stats->pcnt_second_ref;
  gf_stats->avg_sr_coded_error = gf_stats->avg_sr_coded_error + stats->sr_coded_error;
  gf_stats->avg_pcnt_second_ref = gf_stats->avg_pcnt_second_ref + dVar1;
  dVar1 = stats->frame_avg_wavelet_energy;
  gf_stats->avg_new_mv_count = stats->new_mv_count + gf_stats->avg_new_mv_count;
  gf_stats->avg_wavelet_energy = dVar1 + gf_stats->avg_wavelet_energy;
  dVar1 = stats->raw_error_stdev;
  if (1e-06 < ABS(dVar1)) {
    gf_stats->non_zero_stdev_count = gf_stats->non_zero_stdev_count + 1;
    gf_stats->avg_raw_err_stdev = dVar1 + gf_stats->avg_raw_err_stdev;
  }
  if (flash_detected == 0) {
    gf_stats->last_loop_decay_rate = gf_stats->loop_decay_rate;
    dVar1 = get_prediction_decay_rate(stats);
    gf_stats->loop_decay_rate = dVar1;
    gf_stats->decay_accumulator = dVar1 * gf_stats->decay_accumulator;
    if (2 < cur_idx + frames_since_key) {
      dVar1 = gf_stats->zero_motion_accumulator;
      dVar2 = stats->pcnt_inter - stats->pcnt_motion;
      dVar3 = get_sr_decay_rate(stats);
      if (dVar2 <= dVar3) {
        dVar3 = dVar2;
      }
      if (dVar3 <= dVar1) {
        dVar1 = dVar3;
      }
      gf_stats->zero_motion_accumulator = dVar1;
    }
  }
  return;
}

Assistant:

static void accumulate_next_frame_stats(const FIRSTPASS_STATS *stats,
                                        const int flash_detected,
                                        const int frames_since_key,
                                        const int cur_idx,
                                        GF_GROUP_STATS *gf_stats, int f_w,
                                        int f_h) {
  accumulate_frame_motion_stats(stats, gf_stats, f_w, f_h);
  // sum up the metric values of current gf group
  gf_stats->avg_sr_coded_error += stats->sr_coded_error;
  gf_stats->avg_pcnt_second_ref += stats->pcnt_second_ref;
  gf_stats->avg_new_mv_count += stats->new_mv_count;
  gf_stats->avg_wavelet_energy += stats->frame_avg_wavelet_energy;
  if (fabs(stats->raw_error_stdev) > 0.000001) {
    gf_stats->non_zero_stdev_count++;
    gf_stats->avg_raw_err_stdev += stats->raw_error_stdev;
  }

  // Accumulate the effect of prediction quality decay
  if (!flash_detected) {
    gf_stats->last_loop_decay_rate = gf_stats->loop_decay_rate;
    gf_stats->loop_decay_rate = get_prediction_decay_rate(stats);

    gf_stats->decay_accumulator =
        gf_stats->decay_accumulator * gf_stats->loop_decay_rate;

    // Monitor for static sections.
    if ((frames_since_key + cur_idx - 1) > 1) {
      gf_stats->zero_motion_accumulator = AOMMIN(
          gf_stats->zero_motion_accumulator, get_zero_motion_factor(stats));
    }
  }
}